

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O1

void realloc_strncat(char **str,char *append,size_t len)

{
  char *__s;
  size_t __n;
  char *__dest;
  int *piVar1;
  
  __s = *str;
  if (__s == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(__s);
  }
  __dest = (char *)malloc(len + __n + 1);
  if (__dest != (char *)0x0) {
    if (__s != (char *)0x0) {
      memcpy(__dest,__s,__n);
    }
    memcpy(__dest + __n,append,len);
    __dest[len + __n] = '\0';
    free(__s);
    *str = __dest;
    return;
  }
  piVar1 = __errno_location();
  lafe_errc(1,*piVar1,"Out of memory");
}

Assistant:

static void
realloc_strncat(char **str, const char *append, size_t len)
{
	char *new_str;
	size_t old_len;

	if (*str == NULL)
		old_len = 0;
	else
		old_len = strlen(*str);

	new_str = malloc(old_len + len + 1);
	if (new_str == NULL)
		lafe_errc(1, errno, "Out of memory");
	if (*str != NULL)
		memcpy(new_str, *str, old_len);
	memcpy(new_str + old_len, append, len);
	new_str[old_len + len] = '\0';
	free(*str);
	*str = new_str;
}